

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::doVisitGeneric(Graph *this,Expression *curr)

{
  Index *this_00;
  bool bVar1;
  Expression **ppEVar2;
  Node *pNVar3;
  Iterator IVar4;
  Expression *child;
  undefined1 local_a0 [8];
  Iterator __end2;
  undefined1 local_70 [8];
  Iterator __begin2;
  ChildIterator *__range2;
  Expression *curr_local;
  Graph *this_local;
  
  this_00 = &__begin2.index;
  ChildIterator::ChildIterator((ChildIterator *)this_00,curr);
  IVar4 = AbstractChildIterator<wasm::ChildIterator>::begin
                    ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
  __end2._8_8_ = IVar4.parent;
  __begin2.parent._0_4_ = IVar4.index;
  local_70 = (undefined1  [8])__end2._8_8_;
  IVar4 = AbstractChildIterator<wasm::ChildIterator>::end
                    ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
  local_a0 = (undefined1  [8])IVar4.parent;
  __end2.parent._0_4_ = IVar4.index;
  while( true ) {
    bVar1 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                      ((Iterator *)local_70,(Iterator *)local_a0);
    if (!bVar1) break;
    ppEVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*((Iterator *)local_70);
    Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
              ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,*ppEVar2);
    AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_70);
  }
  ChildIterator::~ChildIterator((ChildIterator *)&__begin2.index);
  pNVar3 = makeVar(this,(Type)(curr->type).id);
  return pNVar3;
}

Assistant:

Node* doVisitGeneric(Expression* curr) {
    // Just need to visit the nodes so we note all the gets
    for (auto* child : ChildIterator(curr)) {
      visit(child);
    }
    return makeVar(curr->type);
  }